

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O0

void __thiscall
DatabaseSnapshot::force_index_files
          (DatabaseSnapshot *this,Task *task,vector<IndexType,_std::allocator<IndexType>_> *types,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *taints,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *targets)

{
  string_view_t fmt;
  bool bVar1;
  TaskSpec *this_00;
  reference ppOVar2;
  string *obj_name;
  Indexer *this_01;
  undefined8 in_RCX;
  int __c;
  string *in_RSI;
  char *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *taint;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  OnDiskDataset *ds;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Indexer indexer;
  DBChange *in_stack_fffffffffffffd38;
  TaskSpec *in_stack_fffffffffffffd40;
  Indexer *in_stack_fffffffffffffd48;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_stack_fffffffffffffd50;
  string *parameter;
  TaskSpec *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  vector<IndexType,_std::allocator<IndexType>_> *in_stack_fffffffffffffd90;
  DatabaseSnapshot *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  _Self local_208;
  _Self local_200;
  undefined8 local_1f8;
  undefined1 local_1e9 [37];
  undefined4 local_1c4;
  OnDiskDataset *in_stack_fffffffffffffe48;
  __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
  local_168;
  undefined1 local_160 [24];
  undefined1 *local_148;
  reference local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_118;
  Indexer local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  undefined8 local_20;
  string *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd50);
  if (!bVar1) {
    Indexer::Indexer((Indexer *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    this_00 = Task::spec((Task *)local_10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size(local_28);
    TaskSpec::estimate_work(in_stack_fffffffffffffd40,(uint64_t)in_stack_fffffffffffffd38);
    local_118 = local_28;
    local_120._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd38);
    local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffd38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffd40,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffd38), bVar1) {
      local_130 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_120);
      ::fmt::v6::basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)in_stack_fffffffffffffd40,
                 (char *)in_stack_fffffffffffffd38);
      fmt.size_ = (size_t)in_stack_fffffffffffffd50;
      fmt.data_ = (char *)in_stack_fffffffffffffd48;
      spdlog::debug<std::__cxx11::string>
                (fmt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd40);
      Indexer::index(&local_100,(char *)local_130,__c);
      in_stack_fffffffffffffd68 = Task::spec((Task *)local_10);
      TaskSpec::add_progress(in_stack_fffffffffffffd40,(uint64_t)in_stack_fffffffffffffd38);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_120);
    }
    Indexer::finalize(in_stack_fffffffffffffd48);
    local_148 = local_160;
    local_168._M_current =
         (OnDiskDataset **)
         std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::begin
                   ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                    in_stack_fffffffffffffd38);
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::end
              ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
               in_stack_fffffffffffffd38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                               *)in_stack_fffffffffffffd40,
                              (__normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                               *)in_stack_fffffffffffffd38), bVar1) {
      ppOVar2 = __gnu_cxx::
                __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                ::operator*(&local_168);
      local_1c4 = 1;
      parameter = local_10;
      obj_name = OnDiskDataset::get_name_abi_cxx11_(*ppOVar2);
      in_stack_fffffffffffffd50 =
           (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)local_1e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd80,in_RDI,(allocator<char> *)this_00);
      DBChange::DBChange((DBChange *)this_00,(DbChangeType *)in_stack_fffffffffffffd68,obj_name,
                         parameter);
      Task::change((Task *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      DBChange::~DBChange((DBChange *)in_stack_fffffffffffffd40);
      std::__cxx11::string::~string((string *)(local_1e9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1e9);
      local_1f8 = local_20;
      local_200._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffd38);
      local_208._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd38);
      while (bVar1 = std::operator!=(&local_200,&local_208), bVar1) {
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x165c9d);
        OnDiskDataset::get_id_abi_cxx11_(in_stack_fffffffffffffe48);
        DBChange::DBChange((DBChange *)this_00,(DbChangeType *)in_stack_fffffffffffffd68,obj_name,
                           parameter);
        Task::change((Task *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        DBChange::~DBChange((DBChange *)in_stack_fffffffffffffd40);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd80);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffd40);
      }
      __gnu_cxx::
      __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
      ::operator++(&local_168);
    }
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~vector
              (in_stack_fffffffffffffd50);
    this_01 = (Indexer *)Task::spec((Task *)local_10);
    TaskSpec::add_progress((TaskSpec *)this_01,(uint64_t)in_stack_fffffffffffffd38);
    Indexer::~Indexer(this_01);
  }
  return;
}

Assistant:

void DatabaseSnapshot::force_index_files(
    Task *task, const std::vector<IndexType> &types,
    const std::set<std::string> &taints,
    const std::vector<std::string> &targets) const {
    if (targets.empty()) {
        return;
    }

    Indexer indexer(this, types);

    task->spec().estimate_work(targets.size() + 1);

    for (const auto &target : targets) {
        spdlog::debug("Indexing {}", target);
        indexer.index(target);
        task->spec().add_progress(1);
    }

    for (const auto *ds : indexer.finalize()) {
        task->change(DBChange(DbChangeType::Insert, ds->get_name()));
        for (const auto &taint : taints) {
            task->change(
                DBChange(DbChangeType::ToggleTaint, ds->get_id(), taint));
        }
    }

    task->spec().add_progress(1);
}